

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O1

bool iDynTree::computeLinkNetWrenchesWithoutGravity
               (Model *model,LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
               LinkNetTotalWrenchesWithoutGravity *linkNetWrenchesWithoutGravity)

{
  Twist *pTVar1;
  SpatialMomentum *pSVar2;
  Wrench *this;
  long lVar3;
  long lVar4;
  Wrench local_110;
  SpatialInertia local_d8 [56];
  Twist local_a0 [56];
  SpatialInertia local_68 [56];
  
  lVar4 = iDynTree::Model::getNrOfLinks();
  if (0 < lVar4) {
    lVar4 = 0;
    do {
      iDynTree::Model::getLink((long)model);
      pTVar1 = (Twist *)iDynTree::Link::getInertia();
      iDynTree::LinkAccArray::operator()(linkProperAcc,lVar4);
      pSVar2 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(linkVel,lVar4);
      iDynTree::SpatialInertia::operator*(local_68,(SpatialAcc *)pTVar1);
      iDynTree::SpatialInertia::operator*(local_d8,pTVar1);
      iDynTree::Twist::operator*(local_a0,pSVar2);
      iDynTree::Wrench::operator+(&local_110,(Wrench *)local_68);
      this = (Wrench *)iDynTree::LinkWrenches::operator()(linkNetWrenchesWithoutGravity,lVar4);
      iDynTree::Wrench::operator=(this,(Wrench *)&local_110.super_SpatialForceVector);
      iDynTree::SpatialForceVector::~SpatialForceVector(&local_110.super_SpatialForceVector);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_a0);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_d8);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_68);
      lVar4 = lVar4 + 1;
      lVar3 = iDynTree::Model::getNrOfLinks();
    } while (lVar4 < lVar3);
  }
  return true;
}

Assistant:

bool computeLinkNetWrenchesWithoutGravity(const Model& model,
                                          const LinkVelArray& linkVel,
                                          const LinkAccArray& linkProperAcc,
                                                LinkNetTotalWrenchesWithoutGravity& linkNetWrenchesWithoutGravity)
{
     // Note that we are not using a Traversal here: the main reason
     // is that given that the computation that we are doing (once we have the linkVel and linkProperAcc
     // does not depend on the topology, so we can visit the links in any possible order
     for(LinkIndex visitedLinkIndex = 0; visitedLinkIndex < static_cast<LinkIndex>(model.getNrOfLinks()); visitedLinkIndex++)
     {
         LinkConstPtr visitedLink = model.getLink(visitedLinkIndex);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAcc(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVel(visitedLinkIndex);
         linkNetWrenchesWithoutGravity(visitedLinkIndex) = I*properAcc + v*(I*v);
     }

     return true;
}